

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int ncnn::set_cpu_powersave(int powersave)

{
  if ((uint)powersave < 3) {
    if (g_thread_affinity_mask_all == '\0') {
      g_thread_affinity_mask_all = '\x01';
    }
  }
  else {
    fprintf(_stderr,"powersave %d not supported\n",(ulong)(uint)powersave);
  }
  return -1;
}

Assistant:

int set_cpu_powersave(int powersave)
{
    if (powersave < 0 || powersave > 2)
    {
        fprintf(stderr, "powersave %d not supported\n", powersave);
        return -1;
    }

    size_t thread_affinity_mask = get_cpu_thread_affinity_mask(powersave);

    int ret = set_cpu_thread_affinity(thread_affinity_mask);
    if (ret != 0)
        return ret;

    g_powersave = powersave;

    return 0;
}